

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TTActionEvents.h
# Opt level: O0

void TTD::NSLogEvents::JsRTByteBufferAction_Emit<(TTD::NSLogEvents::EventKind)39>
               (EventLogEntry *evt,FileWriter *writer,ThreadContext *threadContext)

{
  JsRTByteBufferAction *pJVar1;
  bool local_31;
  uint local_30;
  uint32 i;
  bool badValue;
  JsRTByteBufferAction *bufferAction;
  ThreadContext *threadContext_local;
  FileWriter *writer_local;
  EventLogEntry *evt_local;
  
  pJVar1 = GetInlineEventDataAs<TTD::NSLogEvents::JsRTByteBufferAction,(TTD::NSLogEvents::EventKind)39>
                     (evt);
  (*writer->_vptr_FileWriter[3])(writer,0x12,1);
  NSSnapValues::EmitTTDVar(pJVar1->Result,writer,NoSeparator);
  local_31 = false;
  if (pJVar1->Buffer == (byte *)0x0) {
    local_31 = pJVar1->Length != 0;
  }
  (*writer->_vptr_FileWriter[0xc])(writer,10,(ulong)local_31,1);
  FileWriter::WriteLengthValue(writer,pJVar1->Length,CommaSeparator);
  FileWriter::WriteSequenceStart_DefaultKey(writer,CommaSeparator);
  if (local_31 == false) {
    for (local_30 = 0; local_30 < pJVar1->Length; local_30 = local_30 + 1) {
      (*writer->_vptr_FileWriter[0xb])
                (writer,(ulong)pJVar1->Buffer[local_30],(ulong)(local_30 != 0));
    }
  }
  (*writer->_vptr_FileWriter[5])(writer,0);
  return;
}

Assistant:

void JsRTByteBufferAction_Emit(const EventLogEntry* evt, FileWriter* writer, ThreadContext* threadContext)
        {
            const JsRTByteBufferAction* bufferAction = GetInlineEventDataAs<JsRTByteBufferAction, tag>(evt);

            writer->WriteKey(NSTokens::Key::argRetVal, NSTokens::Separator::CommaSeparator);
            NSSnapValues::EmitTTDVar(bufferAction->Result, writer, NSTokens::Separator::NoSeparator);

            bool badValue = (bufferAction->Buffer == nullptr && bufferAction->Length > 0);
            writer->WriteBool(NSTokens::Key::boolVal, badValue, NSTokens::Separator::CommaSeparator);

            writer->WriteLengthValue(bufferAction->Length, NSTokens::Separator::CommaSeparator);
            writer->WriteSequenceStart_DefaultKey(NSTokens::Separator::CommaSeparator);
            if(!badValue)
            {
                for(uint32 i = 0; i < bufferAction->Length; ++i)
                {
                    writer->WriteNakedByte(bufferAction->Buffer[i], i != 0 ? NSTokens::Separator::CommaSeparator : NSTokens::Separator::NoSeparator);
                }
            }
            writer->WriteSequenceEnd();
        }